

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3DbStrDup(sqlite3 *db,char *z)

{
  size_t sVar1;
  sqlite3 *in_RSI;
  size_t n;
  char *zNew;
  undefined1 *n_00;
  char *local_8;
  
  n_00 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_RSI == (sqlite3 *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = strlen((char *)in_RSI);
    local_8 = (char *)sqlite3DbMallocRaw(in_RSI,(u64)n_00);
    if (local_8 != (char *)0x0) {
      memcpy(local_8,in_RSI,sVar1 + 1);
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbStrDup(sqlite3 *db, const char *z){
  char *zNew;
  size_t n;
  if( z==0 ){
    return 0;
  }
  n = strlen(z) + 1;
  zNew = sqlite3DbMallocRaw(db, n);
  if( zNew ){
    memcpy(zNew, z, n);
  }
  return zNew;
}